

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

Integer pnga_locate_num_blocks(Integer g_a,Integer *lo,Integer *hi)

{
  long in_RDX;
  long in_RSI;
  long in_RDI;
  Integer thi [7];
  Integer tlo [7];
  Integer j;
  Integer i;
  Integer chk;
  Integer nblocks;
  Integer cnt;
  Integer d;
  Integer ret;
  Integer ndim;
  Integer ga_handle;
  Integer *in_stack_00000228;
  Integer *in_stack_00000230;
  Integer in_stack_00000238;
  Integer in_stack_00000240;
  long local_d8 [8];
  long local_98 [7];
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  long local_38;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_20 = in_RDI + 1000;
  local_28 = (long)GA[local_20].ndim;
  local_30 = -1;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_38 = 0; local_38 < GA[local_20].ndim; local_38 = local_38 + 1) {
    if (((*(long *)(local_10 + local_38 * 8) < 1) ||
        (GA[local_20].dims[local_38] < *(long *)(local_18 + local_38 * 8))) ||
       (*(long *)(local_18 + local_38 * 8) < *(long *)(local_10 + local_38 * 8))) {
      pnga_error((char *)ndim,ret);
    }
  }
  if (GA[local_20].distr_type != 0) {
    local_48 = GA[local_20].block_total;
    local_40 = 0;
    for (local_58 = 0; local_58 < local_48; local_58 = local_58 + 1) {
      local_50 = 1;
      pnga_distribution(in_stack_00000240,in_stack_00000238,in_stack_00000230,in_stack_00000228);
      for (local_60 = 0; local_60 < local_28 && local_50 == 1; local_60 = local_60 + 1) {
        if (((local_98[local_60] < *(long *)(local_10 + local_60 * 8)) ||
            (*(long *)(local_18 + local_60 * 8) < local_98[local_60])) &&
           ((local_d8[local_60] < *(long *)(local_10 + local_60 * 8) ||
            (*(long *)(local_18 + local_60 * 8) < local_d8[local_60])))) {
          local_50 = 0;
        }
      }
      if (local_50 != 0) {
        local_40 = local_40 + 1;
      }
    }
    local_30 = local_40;
  }
  return local_30;
}

Assistant:

Integer pnga_locate_num_blocks(Integer g_a, Integer *lo, Integer *hi)
{
  Integer ga_handle = GA_OFFSET + g_a;
  Integer ndim = GA[ga_handle].ndim;
  Integer ret = -1, d;
  Integer cnt;

  for(d = 0; d< GA[ga_handle].ndim; d++)
    if((lo[d]<1 || hi[d]>GA[ga_handle].dims[d]) ||(lo[d]>hi[d]))
      pnga_error("Requested region out of bounds",0);

  if (GA[ga_handle].distr_type != REGULAR) {
    Integer nblocks = GA[ga_handle].block_total;
    Integer chk, i, j, tlo[MAXDIM], thi[MAXDIM];
    cnt = 0;
    for (i=0; i<nblocks; i++) {
      /* check to see if this block overlaps with requested block
       * defined by lo and hi */
      chk = 1;
      /* get limits on block i */
      pnga_distribution(g_a,i,tlo,thi);
      for (j=0; j<ndim && chk==1; j++) {
        /* check to see if at least one end point of the interval
         * represented by blo and bhi falls in the interval
         * represented by lo and hi */
        if (!((tlo[j] >= lo[j] && tlo[j] <= hi[j]) ||
              (thi[j] >= lo[j] && thi[j] <= hi[j]))) {
          chk = 0;
        }
      }

      if (chk) {
        cnt++;
      }
    }
    ret = cnt;
  }

  return ret;
}